

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void count_suite::count_full(void)

{
  basic_iterator<int> __first;
  basic_iterator<int> __first_00;
  _Iter_equals_val<const_int> __pred;
  _Iter_equals_val<const_int> __pred_00;
  basic_iterator<int> __last;
  basic_iterator<int> __last_00;
  view_pointer pcVar1;
  initializer_list<int> input;
  size_type in_stack_ffffffffffffff68;
  undefined1 *puVar2;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar3;
  size_type sVar4;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  pcVar1 = (view_pointer)0x160000000b;
  sVar4 = 0x2c00000021;
  input._M_len = 5;
  input._M_array = (iterator)&stack0xffffffffffffff78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::end(&span);
  __first.current = in_stack_ffffffffffffff68;
  __first.parent = (view_pointer)0x1024f6;
  __last.current = sVar4;
  __last.parent = pcVar1;
  __pred._M_value._4_4_ = in_stack_ffffffffffffff74;
  __pred._M_value._0_4_ = 0xb;
  pcVar1 = (view_pointer)
           std::
           __count_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (__first,__last,__pred);
  uVar3 = 0;
  puVar2 = &stack0xffffffffffffff74;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 11)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe8,"void count_suite::count_full()",&stack0xffffffffffffff78);
  vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::end(&span);
  __first_00.current = (size_type)puVar2;
  __first_00.parent = (view_pointer)0x102568;
  __last_00.current = sVar4;
  __last_00.parent = pcVar1;
  __pred_00._M_value._4_4_ = uVar3;
  __pred_00._M_value._0_4_ = 0x16;
  std::
  __count_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
            (__first_00,__last_00,__pred_00);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 22)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe9,"void count_suite::count_full()",&stack0xffffffffffffff78,
             &stack0xffffffffffffff74);
  return;
}

Assistant:

void count_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 11), 0);
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 22), 1);
}